

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O0

void __thiscall Am_Priority_List::Delete(Am_Priority_List *this)

{
  Am_Priority_List_Item *item_00;
  Am_Priority_List_Item *item;
  Am_Priority_List *this_local;
  
  if (this->current != (Am_Priority_List_Item *)0x0) {
    item_00 = this->current;
    take_out_item(this,item_00);
    if (item_00 != (Am_Priority_List_Item *)0x0) {
      Am_Priority_List_Item::~Am_Priority_List_Item(item_00);
      operator_delete(item_00);
    }
    return;
  }
  Am_Error("Call to Delete on priority list but no current item");
}

Assistant:

void
Am_Priority_List::Delete()
{
  if (current) {
    Am_Priority_List_Item *item = current;
    this->take_out_item(item); //will adjust current pointer
    delete item;
  } else
    Am_Error("Call to Delete on priority list but no current item");
}